

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

UCalendarDateFields __thiscall
icu_63::Calendar::resolveFields(Calendar *this,UFieldResolutionTable *precedenceTable)

{
  UCalendarDateFields UVar1;
  UCalendarDateFields UVar2;
  int32_t *piVar3;
  int iVar4;
  int32_t *piVar5;
  long lVar6;
  long lVar7;
  int32_t *piVar8;
  int iVar9;
  UCalendarDateFields UVar10;
  UCalendarDateFields UVar11;
  int iVar12;
  
  if ((*precedenceTable)[0][0] == -1) {
    return UCAL_FIELD_COUNT;
  }
  piVar5 = (*precedenceTable)[0] + 1;
  lVar6 = 0;
  do {
    UVar10 = precedenceTable[lVar6][0][0];
    if (UVar10 == ~UCAL_ERA) {
      UVar2 = UCAL_FIELD_COUNT;
    }
    else {
      iVar4 = 0;
      piVar3 = piVar5;
      lVar7 = 0;
      UVar1 = UCAL_FIELD_COUNT;
      do {
        iVar9 = precedenceTable[lVar6][lVar7][0x1f < (int)UVar10];
        iVar12 = 0;
        UVar2 = UVar1;
        if (iVar9 != -1) {
          piVar8 = piVar3 + (0x1f < (int)UVar10);
          iVar12 = 0;
          do {
            iVar9 = this->fStamp[iVar9];
            if (iVar9 == 0) goto LAB_001f33fc;
            if (iVar12 < iVar9) {
              iVar12 = iVar9;
            }
            iVar9 = *piVar8;
            piVar8 = piVar8 + 1;
          } while (iVar9 != -1);
        }
        if (iVar4 < iVar12) {
          UVar2 = UVar10;
          if (0x1f < (int)UVar10) {
            UVar11 = UVar10 & (UCAL_DST_OFFSET|UCAL_ZONE_OFFSET);
            UVar10 = UCAL_DATE;
            UVar2 = UVar1;
            if (UVar11 != UCAL_DATE || this->fStamp[4] < this->fStamp[5]) {
              UVar10 = UVar11;
              UVar2 = UVar11;
            }
          }
          if (UVar2 == UVar10) {
            iVar4 = iVar12;
          }
        }
LAB_001f33fc:
        UVar10 = precedenceTable[lVar6][lVar7 + 1][0];
        piVar3 = piVar3 + 8;
        lVar7 = lVar7 + 1;
        UVar1 = UVar2;
      } while (UVar10 != ~UCAL_ERA);
    }
    lVar6 = lVar6 + 1;
    if ((precedenceTable[lVar6][0][0] == -1) || (piVar5 = piVar5 + 0x60, UVar2 != UCAL_FIELD_COUNT))
    {
      return UVar2;
    }
  } while( true );
}

Assistant:

UCalendarDateFields Calendar::resolveFields(const UFieldResolutionTable* precedenceTable) {
    int32_t bestField = UCAL_FIELD_COUNT;
    int32_t tempBestField;
    for (int32_t g=0; precedenceTable[g][0][0] != -1 && (bestField == UCAL_FIELD_COUNT); ++g) {
        int32_t bestStamp = kUnset;
        for (int32_t l=0; precedenceTable[g][l][0] != -1; ++l) {
            int32_t lineStamp = kUnset;
            // Skip over first entry if it is negative
            for (int32_t i=((precedenceTable[g][l][0]>=kResolveRemap)?1:0); precedenceTable[g][l][i]!=-1; ++i) {
                U_ASSERT(precedenceTable[g][l][i] < UCAL_FIELD_COUNT);
                int32_t s = fStamp[precedenceTable[g][l][i]];
                // If any field is unset then don't use this line
                if (s == kUnset) {
                    goto linesInGroup;
                } else if(s > lineStamp) {
                    lineStamp = s;
                }
            }
            // Record new maximum stamp & field no.
            if (lineStamp > bestStamp) {
                tempBestField = precedenceTable[g][l][0]; // First field refers to entire line
                if (tempBestField >= kResolveRemap) {
                    tempBestField &= (kResolveRemap-1);
                    // This check is needed to resolve some issues with UCAL_YEAR precedence mapping
                    if (tempBestField != UCAL_DATE || (fStamp[UCAL_WEEK_OF_MONTH] < fStamp[tempBestField])) {
                        bestField = tempBestField;
                    }
                } else {
                    bestField = tempBestField;
                }

                if (bestField == tempBestField) {
                    bestStamp = lineStamp;
                }
            }
linesInGroup:
            ;
        }
    }
    return (UCalendarDateFields)bestField;
}